

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void resetLocalOptions(vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  HighsOptionType HVar1;
  size_type sVar2;
  reference ppOVar3;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDI;
  OptionRecordString *option_3;
  OptionRecordDouble *option_2;
  OptionRecordInt *option_1;
  OptionRecordBool *option;
  HighsOptionType type;
  HighsInt index;
  HighsInt num_options;
  int local_10;
  
  sVar2 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size(in_RDI);
  for (local_10 = 0; local_10 < (int)sVar2; local_10 = local_10 + 1) {
    ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDI,(long)local_10);
    HVar1 = (*ppOVar3)->type;
    if (HVar1 == kBool) {
      ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDI,(long)local_10);
      *(undefined1 *)(*ppOVar3)[1]._vptr_OptionRecord = (char)(*ppOVar3)[1].type & kInt;
    }
    else if (HVar1 == kInt) {
      ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDI,(long)local_10);
      *(undefined4 *)(*ppOVar3)[1]._vptr_OptionRecord = *(undefined4 *)&(*ppOVar3)[1].field_0xc;
    }
    else if (HVar1 == kDouble) {
      ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDI,(long)local_10);
      *(*ppOVar3)[1]._vptr_OptionRecord = (_func_int *)(*ppOVar3)[1].name._M_string_length;
    }
    else {
      ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDI,(long)local_10);
      std::__cxx11::string::operator=
                ((string *)(*ppOVar3)[1]._vptr_OptionRecord,(string *)&(*ppOVar3)[1].type);
    }
  }
  return;
}

Assistant:

void resetLocalOptions(std::vector<OptionRecord*>& option_records) {
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = option_records[index]->type;
    if (type == HighsOptionType::kBool) {
      OptionRecordBool& option = ((OptionRecordBool*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else if (type == HighsOptionType::kInt) {
      OptionRecordInt& option = ((OptionRecordInt*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else if (type == HighsOptionType::kDouble) {
      OptionRecordDouble& option =
          ((OptionRecordDouble*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else {
      OptionRecordString& option =
          ((OptionRecordString*)option_records[index])[0];
      *(option.value) = option.default_value;
    }
  }
}